

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::VariableNotDefined::VariableNotDefined(VariableNotDefined *this,string *function)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&local_30);
  SyntaxError::SyntaxError(&this->super_SyntaxError,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&this->super_SyntaxError = &PTR__SyntaxError_00116748;
  std::operator+(&local_30,"Error: variable [",function);
  std::operator+(&local_50,&local_30,"] not defined!");
  std::__cxx11::string::operator=
            ((string *)&(this->super_SyntaxError).error_msg,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

VariableNotDefined(const std::string& function) {
        error_msg = "Error: variable [" + function + "] not defined!";
    }